

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_class_default_ctor(JSParseState *s,BOOL has_super,JSFunctionDef **pfd)

{
  uint8_t *puVar1;
  uint uVar2;
  size_t sVar3;
  JSParseState *in_RDX;
  int in_ESI;
  JSParseState *in_RDI;
  uint8_t *saved_buf_end;
  JSParseFunctionEnum func_type;
  int line_num;
  int ret;
  char *str;
  JSParsePos pos;
  JSParseState *in_stack_00000068;
  JSParseExportEnum in_stack_00000080;
  JSFunctionDef **in_stack_00000088;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  JSParseState *in_stack_ffffffffffffffa0;
  uint local_3c;
  uint8_t *local_38;
  JSParsePos local_30;
  JSParseState *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  js_parse_get_pos(in_RDI,&local_30);
  if (local_c == 0) {
    local_38 = "(){}";
  }
  else {
    local_38 = "(){super(...arguments);}";
  }
  puVar1 = in_RDI->buf_end;
  in_RDI->buf_ptr = local_38;
  sVar3 = strlen((char *)local_38);
  in_RDI->buf_end = local_38 + sVar3;
  local_3c = next_token(in_RDI);
  if (local_3c == 0) {
    in_stack_ffffffffffffff98 = 0;
    local_3c = js_parse_function_decl2
                         (in_stack_00000068,s._4_4_,(JSFunctionKindEnum)s,has_super,(uint8_t *)pfd,
                          pos.ptr._4_4_,in_stack_00000080,in_stack_00000088);
    in_stack_ffffffffffffffa0 = local_18;
  }
  in_RDI->buf_end = puVar1;
  uVar2 = js_parse_seek_token(in_stack_ffffffffffffffa0,
                              (JSParsePos *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  return uVar2 | local_3c;
}

Assistant:

static __exception int js_parse_class_default_ctor(JSParseState *s,
                                                   BOOL has_super,
                                                   JSFunctionDef **pfd)
{
    JSParsePos pos;
    const char *str;
    int ret, line_num;
    JSParseFunctionEnum func_type;
    const uint8_t *saved_buf_end;
    
    js_parse_get_pos(s, &pos);
    if (has_super) {
        /* spec change: no argument evaluation */
        str = "(){super(...arguments);}";
        func_type = JS_PARSE_FUNC_DERIVED_CLASS_CONSTRUCTOR;
    } else {
        str = "(){}";
        func_type = JS_PARSE_FUNC_CLASS_CONSTRUCTOR;
    }
    line_num = s->token.line_num;
    saved_buf_end = s->buf_end;
    s->buf_ptr = (uint8_t *)str;
    s->buf_end = (uint8_t *)(str + strlen(str));
    ret = next_token(s);
    if (!ret) {
        ret = js_parse_function_decl2(s, func_type, JS_FUNC_NORMAL,
                                      JS_ATOM_NULL, (uint8_t *)str,
                                      line_num, JS_PARSE_EXPORT_NONE, pfd);
    }
    s->buf_end = saved_buf_end;
    ret |= js_parse_seek_token(s, &pos);
    return ret;
}